

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O1

void __thiscall Js::String::Set(String *this,char16 *pszValue)

{
  ulong uVar1;
  short sVar2;
  size_t sVar3;
  size_t sVar4;
  char16 *pcVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  if (this->pszValue != (char16_t *)0x0) {
    sVar3 = PAL_wcslen(this->pszValue);
    Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,sVar3 + 1,this->pszValue);
  }
  if (pszValue == (char16 *)0x0) {
    this->pszValue = (char16 *)0x0;
    return;
  }
  sVar4 = PAL_wcslen(pszValue);
  uVar8 = sVar4 + 1;
  sVar3 = 0xffffffffffffffff;
  if (-1 < (long)uVar8) {
    sVar3 = uVar8 * 2;
  }
  pcVar5 = (char16 *)
           Memory::NoCheckHeapAllocator::Alloc
                     ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,sVar3);
  this->pszValue = pcVar5;
  if (pcVar5 != (char16 *)0x0 && uVar8 != 0) {
    lVar7 = 0;
    uVar6 = uVar8;
    do {
      sVar2 = *(short *)((long)pszValue + lVar7);
      *(short *)((long)pcVar5 + lVar7) = sVar2;
      if (sVar2 == 0) goto LAB_001e5b2d;
      lVar7 = lVar7 + 2;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    uVar6 = 0;
LAB_001e5b2d:
    if (uVar6 != 0) {
      uVar1 = (uVar8 - uVar6) + 1;
      if (uVar8 <= uVar1) {
        return;
      }
      memset(pcVar5 + uVar1,0xfd,(sVar4 - (uVar8 - uVar6)) * 2);
      return;
    }
    *pcVar5 = L'\0';
    if (1 < uVar8) {
      memset(pcVar5 + 1,0xfd,uVar8 * 2 - 2);
    }
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return;
}

Assistant:

void
    String::Set(__in_z_opt const char16* pszValue)
    {
        if(NULL != this->pszValue)
        {
            NoCheckHeapDeleteArray(wcslen(this->pszValue) + 1, this->pszValue);
        }

        if(NULL != pszValue)
        {
            size_t size    = 1 + wcslen(pszValue);
            this->pszValue  = NoCheckHeapNewArray(char16, size);
            wcscpy_s(this->pszValue, size, pszValue);
        }
        else
        {
            this->pszValue = NULL;
        }
    }